

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrite.cpp
# Opt level: O3

bool __thiscall stk::FileWrite::setAifFile(FileWrite *this,string *fileName)

{
  pointer pcVar1;
  StkFormat SVar2;
  long lVar3;
  FILE *pFVar4;
  ulong uVar5;
  size_t sVar6;
  ushort uVar7;
  bool bVar8;
  char zeroes [2];
  unsigned_long rate;
  char type [4];
  AifHeader hdr;
  AifSsnd ssnd;
  string name;
  undefined2 local_ac;
  short local_aa;
  ulong local_a8;
  undefined4 local_9c;
  undefined1 local_98 [48];
  undefined8 local_68;
  uchar auStack_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pcVar1 = (fileName->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + fileName->_M_string_length);
  lVar3 = std::__cxx11::string::find((char *)fileName,0x112430,0);
  if (lVar3 == -1) {
    std::__cxx11::string::append((char *)fileName);
  }
  pFVar4 = fopen((fileName->_M_dataplus)._M_p,"wb");
  this->fd_ = (FILE *)pFVar4;
  if (pFVar4 == (FILE *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&Stk::oStream__abi_cxx11_,"FileWrite: could not create AIF file: ",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&Stk::oStream__abi_cxx11_,(fileName->_M_dataplus)._M_p,
               fileName->_M_string_length);
  }
  else {
    local_98._32_2_ = 0x10;
    local_98._44_4_ = 0;
    local_98._24_8_ = 0;
    local_98._0_8_ = 0x2e4d524f46;
    local_98._8_8_ = 0x4d4d4f4346464941;
    local_68 = 0x8444e5353;
    auStack_60[0] = '\0';
    auStack_60[1] = '\0';
    auStack_60[2] = '\0';
    auStack_60[3] = '\0';
    auStack_60[4] = '\0';
    auStack_60[5] = '\0';
    auStack_60[6] = '\0';
    auStack_60[7] = '\0';
    auStack_60[8] = '\0';
    auStack_60[9] = '\0';
    auStack_60[10] = '\0';
    auStack_60[0xb] = '\0';
    auStack_60[0xc] = '\0';
    auStack_60[0xd] = '\0';
    auStack_60[0xe] = '\0';
    auStack_60[0xf] = '\0';
    local_98._20_2_ = (undefined2)this->channels_;
    local_98._16_4_ = 0x12;
    local_98._22_2_ = 0;
    SVar2 = this->dataType_;
    if (SVar2 == 1) {
      local_98._32_2_ = 8;
    }
    else if (SVar2 == 2) {
      local_98._32_2_ = 0x10;
    }
    else if (SVar2 == 4) {
      local_98._32_2_ = 0x18;
    }
    else if (SVar2 == 8) {
      local_98._32_2_ = 0x20;
    }
    else {
      if (SVar2 == 0x10) {
        local_98._32_2_ = 0x20;
      }
      else {
        if (SVar2 != 0x20) goto LAB_0010fa37;
        local_98._32_2_ = 0x40;
      }
      local_98._8_8_ = 0x4d4d4f4343464941;
      local_98._22_2_ = 0;
      local_98._16_4_ = 0x18;
    }
LAB_0010fa37:
    local_a8 = (long)(Stk::srate_ - 9.223372036854776e+18) & (long)Stk::srate_ >> 0x3f |
               (long)Stk::srate_;
    local_98._34_2_ = 0;
    local_98._36_4_ = 0;
    local_98._40_2_ = 0;
    local_98._42_2_ = 0;
    local_aa = 0x3fff;
    if (1 < local_a8) {
      local_aa = 0x3fff;
      uVar5 = local_a8;
      do {
        uVar7 = local_aa + 0xc001;
        local_aa = local_aa + 1;
        if (0x1e < uVar7) break;
        bVar8 = 3 < uVar5;
        uVar5 = uVar5 >> 1;
      } while (bVar8);
    }
    Stk::swap16((uchar *)&local_aa);
    local_98._34_2_ = local_aa;
    local_aa = 0x20;
    do {
      if ((int)local_a8 < 0) goto LAB_0010fadd;
      local_a8 = local_a8 * 2;
      local_aa = local_aa + -1;
    } while (local_aa != 0);
    local_aa = 0;
LAB_0010fadd:
    Stk::swap32((uchar *)&local_a8);
    local_98._36_4_ = (undefined4)local_a8;
    local_98._40_2_ = (undefined2)(local_a8 >> 0x20);
    local_98._42_2_ = (undefined2)(local_a8 >> 0x30);
    this->byteswap_ = true;
    Stk::swap32(local_98 + 4);
    Stk::swap32(local_98 + 0x10);
    Stk::swap16(local_98 + 0x14);
    Stk::swap16(local_98 + 0x20);
    Stk::swap32((uchar *)((long)&local_68 + 4));
    Stk::swap32(auStack_60);
    Stk::swap32(auStack_60 + 8);
    sVar6 = fwrite(local_98,4,5,(FILE *)this->fd_);
    if (sVar6 == 5) {
      sVar6 = fwrite(local_98 + 0x14,2,1,(FILE *)this->fd_);
      if (sVar6 == 1) {
        sVar6 = fwrite(local_98 + 0x18,4,1,(FILE *)this->fd_);
        if (sVar6 == 1) {
          sVar6 = fwrite(local_98 + 0x20,2,1,(FILE *)this->fd_);
          if (sVar6 == 1) {
            sVar6 = fwrite(local_98 + 0x22,10,1,(FILE *)this->fd_);
            if (sVar6 == 1) {
              if (this->dataType_ == 0x10) {
                local_9c = 0x32336c66;
LAB_0010fc19:
                local_ac = 0;
                sVar6 = fwrite(&local_9c,4,1,(FILE *)this->fd_);
                if (sVar6 == 1) {
                  sVar6 = fwrite(&local_ac,2,1,(FILE *)this->fd_);
                  if (sVar6 == 1) goto LAB_0010fc57;
                }
              }
              else {
                if (this->dataType_ == 0x20) {
                  local_9c = 0x34366c66;
                  goto LAB_0010fc19;
                }
LAB_0010fc57:
                sVar6 = fwrite(&local_68,4,4,(FILE *)this->fd_);
                if (sVar6 == 4) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&Stk::oStream__abi_cxx11_,"FileWrite: creating AIF file: ",
                             0x1e);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&Stk::oStream__abi_cxx11_,(fileName->_M_dataplus)._M_p,
                             fileName->_M_string_length);
                  bVar8 = true;
                  Stk::handleError(&this->super_Stk,STATUS);
                  goto LAB_0010fcdb;
                }
              }
            }
          }
        }
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&Stk::oStream__abi_cxx11_,
               "FileWrite: could not write AIF header for file: ",0x30);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&Stk::oStream__abi_cxx11_,(fileName->_M_dataplus)._M_p,
               fileName->_M_string_length);
  }
  bVar8 = false;
LAB_0010fcdb:
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return bVar8;
}

Assistant:

bool FileWrite :: setAifFile( std::string fileName )
{
  std::string name( fileName );
  if ( fileName.find( ".aif" ) == std::string::npos ) fileName += ".aif";
  fd_ = fopen( fileName.c_str(), "wb" );
  if ( !fd_ ) {
    oStream_ << "FileWrite: could not create AIF file: " << fileName;
    return false;
  }

  // Common parts of AIFF/AIFC header.
  struct AifHeader hdr = {{'F','O','R','M'}, 46, {'A','I','F','F'}, {'C','O','M','M'}, 18, 0, 0, 16, "0"};
  struct AifSsnd ssnd = {{'S','S','N','D'}, 8, 0, 0};
  hdr.nChannels = channels_;
  if ( dataType_ == STK_SINT8 )
    hdr.sampleSize = 8;
  else if ( dataType_ == STK_SINT16 )
    hdr.sampleSize = 16;
  else if ( dataType_ == STK_SINT24 )
    hdr.sampleSize = 24;
  else if ( dataType_ == STK_SINT32 )
    hdr.sampleSize = 32;
  else if ( dataType_ == STK_FLOAT32 ) {
    hdr.aiff[3] = 'C';
    hdr.sampleSize = 32;
    hdr.commSize = 24;
  }
  else if ( dataType_ == STK_FLOAT64 ) {
    hdr.aiff[3] = 'C';
    hdr.sampleSize = 64;
    hdr.commSize = 24;
  }

  // For AIFF files, the sample rate is stored in a 10-byte,
  // IEEE Standard 754 floating point number, so we need to
  // convert to that.
  SINT16 i;
  unsigned long exp;
  unsigned long rate = (unsigned long) Stk::sampleRate();
  memset( hdr.srate, 0, 10 );
  exp = rate;
  for ( i=0; i<32; i++ ) {
    exp >>= 1;
    if ( !exp ) break;
  }
  i += 16383;
#ifdef __LITTLE_ENDIAN__
  swap16((unsigned char *)&i);
#endif
  memcpy( hdr.srate, &i, sizeof(SINT16) );

  for ( i=32; i; i-- ) {
    if ( rate & 0x80000000 ) break;
    rate <<= 1;
  }

#ifdef __LITTLE_ENDIAN__
  swap32((unsigned char *)&rate);
#endif
  memcpy( hdr.srate + 2, &rate, sizeof(rate) );

  byteswap_ = false;  
#ifdef __LITTLE_ENDIAN__
  byteswap_ = true;
  swap32((unsigned char *)&hdr.formSize);
  swap32((unsigned char *)&hdr.commSize);
  swap16((unsigned char *)&hdr.nChannels);
  swap16((unsigned char *)&hdr.sampleSize);
  swap32((unsigned char *)&ssnd.ssndSize);
  swap32((unsigned char *)&ssnd.offset);
  swap32((unsigned char *)&ssnd.blockSize);
#endif

  // The structure boundaries don't allow a single write of 54 bytes.
  if ( fwrite(&hdr, 4, 5, fd_) != 5 ) goto error;
  if ( fwrite(&hdr.nChannels, 2, 1, fd_) != 1 ) goto error;
  if ( fwrite(&hdr.sampleFrames, 4, 1, fd_) != 1 ) goto error;
  if ( fwrite(&hdr.sampleSize, 2, 1, fd_) != 1 ) goto error;
  if ( fwrite(&hdr.srate, 10, 1, fd_) != 1 ) goto error;

  if ( dataType_ == STK_FLOAT32 ) {
    char type[4] = {'f','l','3','2'};
    char zeroes[2] = { 0, 0 };
    if ( fwrite(&type, 4, 1, fd_) != 1 ) goto error;
    if ( fwrite(&zeroes, 2, 1, fd_) != 1 ) goto error;
  }
  else if ( dataType_ == STK_FLOAT64 ) {
    char type[4] = {'f','l','6','4'};
    char zeroes[2] = { 0, 0 };
    if ( fwrite(&type, 4, 1, fd_) != 1 ) goto error;
    if ( fwrite(&zeroes, 2, 1, fd_) != 1 ) goto error;
  }
  
  if ( fwrite(&ssnd, 4, 4, fd_) != 4 ) goto error;

  oStream_ << "FileWrite: creating AIF file: " << fileName;
  handleError( StkError::STATUS );
  return true;

 error:
  oStream_ << "FileWrite: could not write AIF header for file: " << fileName;
  return false;
}